

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryGrow *curr)

{
  Type type;
  Name memory;
  Name memory_00;
  char cVar1;
  Address x;
  long lVar2;
  ulong uVar3;
  Address size;
  Literal *this_00;
  Name NVar4;
  undefined1 local_168 [8];
  Flow ret;
  Flow flow;
  Literal local_c0;
  Literal local_a8;
  Literal local_90;
  Literal local_78;
  undefined1 local_60 [8];
  Literal fail;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ret.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x10));
  if (flow.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ret.breakTo.super_IString.str._M_str);
    goto LAB_0019f2cd;
  }
  getMemoryInstanceInfo((MemoryInstanceInfo *)&fail.type,this,(Name)*(string_view *)(curr + 0x20));
  memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory.super_IString.str._M_len = (size_t)info.instance;
  x = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory);
  NVar4.super_IString.str._M_str = (char *)info.instance;
  NVar4.super_IString.str._M_len = *(size_t *)(fail.type.id + 0x20);
  lVar2 = ::wasm::Module::getMemory(NVar4);
  type.id = *(uintptr_t *)(lVar2 + 0x50);
  Literal::makeFromInt64((Literal *)local_60,-1,type);
  Literal::makeFromInt64(&local_78,x.addr,type);
  Flow::Flow((Flow *)local_168,&local_78);
  ::wasm::Literal::~Literal(&local_78);
  Flow::getSingleValue((Flow *)&ret.breakTo.super_IString.str._M_str);
  uVar3 = ::wasm::Literal::getUnsigned();
  if ((uVar3 < 0x10000) || (type.id != 2)) {
    if ((0xffffffff - uVar3 <= x.addr) && (type.id == 2)) {
      this_00 = &local_c0;
      ::wasm::Literal::Literal(this_00,(Literal *)local_60);
      Flow::Flow(__return_storage_ptr__,this_00);
      goto LAB_0019f2b0;
    }
    size.addr = uVar3 + x.addr;
    if (*(ulong *)(lVar2 + 0x40) < size.addr) {
      this_00 = &local_a8;
      ::wasm::Literal::Literal(this_00,(Literal *)local_60);
      Flow::Flow(__return_storage_ptr__,this_00);
      goto LAB_0019f2b0;
    }
    cVar1 = (**(code **)(**(long **)(fail.type.id + 0x288) + 0x30))
                      (*(long **)(fail.type.id + 0x288),info.instance,
                       info.name.super_IString.str._M_len,x.addr << 0x10,size.addr * 0x10000);
    if (cVar1 == '\0') {
      this_00 = &local_90;
      ::wasm::Literal::Literal(this_00,(Literal *)local_60);
      Flow::Flow(__return_storage_ptr__,this_00);
      goto LAB_0019f2b0;
    }
    memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory_00.super_IString.str._M_len = (size_t)info.instance;
    setMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory_00,size);
    Flow::Flow(__return_storage_ptr__,(Flow *)local_168);
  }
  else {
    this_00 = (Literal *)&flow.breakTo.super_IString.str._M_str;
    ::wasm::Literal::Literal(this_00,(Literal *)local_60);
    Flow::Flow(__return_storage_ptr__,this_00);
LAB_0019f2b0:
    ::wasm::Literal::~Literal(this_00);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_168);
  ::wasm::Literal::~Literal((Literal *)local_60);
LAB_0019f2cd:
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ret.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryGrow(MemoryGrow* curr) {
    NOTE_ENTER("MemoryGrow");
    Flow flow = self()->visit(curr->delta);
    if (flow.breaking()) {
      return flow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    auto indexType = memory->indexType;
    auto fail = Literal::makeFromInt64(-1, memory->indexType);
    Flow ret = Literal::makeFromInt64(memorySize, indexType);
    uint64_t delta = flow.getSingleValue().getUnsigned();
    if (delta > uint32_t(-1) / Memory::kPageSize && indexType == Type::i32) {
      return fail;
    }
    if (memorySize >= uint32_t(-1) - delta && indexType == Type::i32) {
      return fail;
    }
    auto newSize = memorySize + delta;
    if (newSize > memory->max) {
      return fail;
    }
    if (!info.instance->externalInterface->growMemory(
          info.name,
          memorySize * Memory::kPageSize,
          newSize * Memory::kPageSize)) {
      // We failed to grow the memory in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    memorySize = newSize;
    info.instance->setMemorySize(info.name, memorySize);
    return ret;
  }